

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_suite.hpp
# Opt level: O0

string * __thiscall
iutest::TestSuite::testsuite_name_with_where_abi_cxx11_
          (string *__return_storage_ptr__,TestSuite *this)

{
  long lVar1;
  char *pcVar2;
  TestSuite *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this + 8));
  lVar1 = (**(code **)(*(long *)this + 0x10))();
  if (lVar1 != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", where TypeParam = ");
    pcVar2 = (char *)(**(code **)(*(long *)this + 0x10))();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string testsuite_name_with_where() const
    {
        ::std::string str = m_testsuite_name;
        if( type_param() != NULL )
        {
            str += ", where TypeParam = ";
            str += type_param();
        }
        return str;
    }